

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

int __thiscall
duckdb::Interpolator<false>::Extract<int,int>(Interpolator<false> *this,int *dest,Vector *result)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [12];
  int result_1;
  int local_44;
  string local_40;
  
  uVar1 = *dest;
  if (this->CRN == this->FRN) {
    bVar3 = TryCast::Operation<int,int>(uVar1,&local_44,false);
    if (!bVar3) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar1,auVar4._8_4_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,&local_40);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar3 = TryCast::Operation<int,int>(uVar1,&local_44,false);
    iVar2 = local_44;
    if (!bVar3) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar1,auVar4._8_4_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,&local_40);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    uVar1 = dest[1];
    bVar3 = TryCast::Operation<int,int>(uVar1,&local_44,false);
    if (!bVar3) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar1,auVar4._8_4_);
      InvalidInputException::InvalidInputException(auVar4._0_8_,&local_40);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_44 = (int)((double)(local_44 - iVar2) *
                     (this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                    (double)iVar2);
  }
  return local_44;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}